

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O2

int mbedtls_ecdsa_from_keypair(mbedtls_ecdsa_context *ctx,mbedtls_ecp_keypair *key)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_group_copy(&ctx->grp,&key->grp);
  if (((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&ctx->d,&key->d), iVar1 == 0)) &&
     (iVar1 = mbedtls_ecp_copy(&ctx->Q,&key->Q), iVar1 == 0)) {
    return 0;
  }
  mbedtls_ecp_keypair_free(ctx);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_from_keypair( mbedtls_ecdsa_context *ctx, const mbedtls_ecp_keypair *key )
{
    int ret;

    if( ( ret = mbedtls_ecp_group_copy( &ctx->grp, &key->grp ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &ctx->d, &key->d ) ) != 0 ||
        ( ret = mbedtls_ecp_copy( &ctx->Q, &key->Q ) ) != 0 )
    {
        mbedtls_ecdsa_free( ctx );
    }

    return( ret );
}